

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_common.hxx
# Opt level: O3

void __thiscall calc_server::server_stuff::server_stuff(server_stuff *this)

{
  this->server_id_ = 1;
  (this->addr_)._M_dataplus._M_p = (pointer)&(this->addr_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->addr_,"localhost","");
  this->port_ = 25000;
  (this->endpoint_)._M_dataplus._M_p = (pointer)&(this->endpoint_).field_2;
  (this->endpoint_)._M_string_length = 0;
  (this->endpoint_).field_2._M_local_buf[0] = '\0';
  (this->raft_logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->raft_logger_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sm_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sm_).super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->smgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->smgr_).super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  nuraft::raft_launcher::raft_launcher(&this->launcher_);
  (this->raft_instance_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->raft_instance_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

server_stuff()
        : server_id_(1)
        , addr_("localhost")
        , port_(25000)
        , raft_logger_(nullptr)
        , sm_(nullptr)
        , smgr_(nullptr)
        , raft_instance_(nullptr)
        {}